

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericCommand.cpp
# Opt level: O3

void __thiscall
Jupiter::GenericCommandNamespace::~GenericCommandNamespace(GenericCommandNamespace *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer ppGVar3;
  
  (this->super_GenericCommand).super_Command._vptr_Command = (_func_int **)&PTR_getHelp_00146280;
  pcVar2 = (this->m_help)._M_dataplus._M_p;
  paVar1 = &(this->m_help).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  ppGVar3 = (this->m_commands).
            super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppGVar3 != (pointer)0x0) {
    operator_delete(ppGVar3,(long)(this->m_commands).
                                  super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppGVar3
                   );
  }
  GenericCommand::~GenericCommand(&this->super_GenericCommand);
  return;
}

Assistant:

Jupiter::GenericCommandNamespace::~GenericCommandNamespace() {
}